

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateBuildPartial
          (MessageBuilderGenerator *this,Printer *printer)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FieldDescriptor *pFVar5;
  OneofGeneratorInfo *args_1;
  Descriptor *pDVar6;
  int index;
  AlphaNum *a;
  iterator iVar7;
  string_view local_248;
  ImmutableFieldGenerator *local_238;
  ImmutableFieldGenerator *field_1;
  undefined1 auStack_228 [4];
  int i_4;
  OneofDescriptor *local_218;
  OneofDescriptor *oneof;
  pair<const_int,_const_google::protobuf::OneofDescriptor_*> *kv;
  int local_200;
  undefined1 local_1f8 [8];
  iterator __end4;
  undefined1 local_1d8 [8];
  iterator __begin4;
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *__range4;
  string_view local_1a0;
  int local_190;
  int local_18c;
  int i_3;
  int start_field;
  ImmutableFieldGenerator *local_178;
  ImmutableFieldGenerator *field;
  undefined1 local_168 [4];
  int i_2;
  string_view local_148;
  string local_138;
  string_view local_118;
  string_view local_108;
  AlphaNum local_f8;
  string local_c8;
  string local_a8;
  string_view local_88;
  uint local_78;
  int local_74;
  int i_1;
  int totalBuilderInts;
  int local_5c;
  byte local_55;
  int i;
  bool has_repeated_fields;
  string local_48;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  MessageBuilderGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "@java.lang.Override\npublic $classname$ buildPartial() {\n  $classname$ result = new $classname$(this);\n"
            );
  ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
            (&local_48,this->name_resolver_,this->descriptor_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,local_28,(char (*) [10])0xa117a7,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  io::Printer::Indent(local_18);
  local_55 = 0;
  local_5c = 0;
  do {
    iVar4 = local_5c;
    iVar3 = Descriptor::field_count(this->descriptor_);
    if (iVar3 <= iVar4) {
LAB_003fffb2:
      iVar4 = Descriptor::field_count(this->descriptor_);
      local_74 = (iVar4 + 0x1f) / 0x20;
      if (0 < local_74) {
        for (local_78 = 0; pPVar1 = local_18, (int)local_78 < local_74; local_78 = local_78 + 1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_88,"if ($bit_field_name$ != 0) { buildPartial$piece$(result); }\n");
          GetBitFieldName_abi_cxx11_(&local_a8,(java *)(ulong)local_78,index);
          absl::lts_20250127::AlphaNum::AlphaNum(&local_f8,local_78);
          absl::lts_20250127::StrCat_abi_cxx11_(&local_c8,(lts_20250127 *)&local_f8,a);
          io::Printer::Print<char[15],std::__cxx11::string,char[6],std::__cxx11::string>
                    (pPVar1,local_88,(char (*) [15])"bit_field_name",&local_a8,(char (*) [6])"piece"
                     ,&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_a8);
        }
      }
      bVar2 = absl::lts_20250127::container_internal::
              btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
              ::empty((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                       *)&this->oneofs_);
      pPVar1 = local_18;
      if (!bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_108,"buildPartialOneofs(result);\n");
        io::Printer::Print<>(pPVar1,local_108);
      }
      io::Printer::Outdent(local_18);
      pPVar1 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_118,"  onBuilt();\n  return result;\n}\n\n");
      ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                (&local_138,this->name_resolver_,this->descriptor_);
      io::Printer::Print<char[10],std::__cxx11::string>
                (pPVar1,local_118,(char (*) [10])0xa117a7,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      pPVar1 = local_18;
      if ((local_55 & 1) != 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_148,"private void buildPartialRepeatedFields($classname$ result) {\n");
        ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                  ((string *)local_168,this->name_resolver_,this->descriptor_);
        io::Printer::Print<char[10],std::__cxx11::string>
                  (pPVar1,local_148,(char (*) [10])0xa117a7,(string *)local_168);
        std::__cxx11::string::~string((string *)local_168);
        io::Printer::Indent(local_18);
        for (field._4_4_ = 0; iVar4 = field._4_4_,
            iVar3 = Descriptor::field_count(this->descriptor_), iVar4 < iVar3;
            field._4_4_ = field._4_4_ + 1) {
          pFVar5 = Descriptor::field(this->descriptor_,field._4_4_);
          bVar2 = anon_unknown_10::BitfieldTracksMutability(pFVar5);
          if (bVar2) {
            pFVar5 = Descriptor::field(this->descriptor_,field._4_4_);
            local_178 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>
                        ::get(&this->field_generators_,pFVar5);
            (*(local_178->super_FieldGenerator)._vptr_FieldGenerator[0xd])(local_178,local_18);
          }
        }
        io::Printer::Outdent(local_18);
        pPVar1 = local_18;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&i_3,"}\n\n");
        io::Printer::Print<>(pPVar1,_i_3);
      }
      local_18c = 0;
      for (local_190 = 0; local_190 < local_74; local_190 = local_190 + 1) {
        local_18c = GenerateBuildPartialPiece(this,local_18,local_190,local_18c);
      }
      bVar2 = absl::lts_20250127::container_internal::
              btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
              ::empty((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                       *)&this->oneofs_);
      pPVar1 = local_18;
      if (!bVar2) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_1a0,"private void buildPartialOneofs($classname$ result) {\n");
        ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                  ((string *)&__range4,this->name_resolver_,this->descriptor_);
        io::Printer::Print<char[10],std::__cxx11::string>
                  (pPVar1,local_1a0,(char (*) [10])0xa117a7,(string *)&__range4);
        std::__cxx11::string::~string((string *)&__range4);
        io::Printer::Indent(local_18);
        __begin4._8_8_ = &this->oneofs_;
        iVar7 = absl::lts_20250127::container_internal::
                btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                ::begin((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                         *)__begin4._8_8_);
        __end4._8_8_ = iVar7.node_;
        __begin4.node_._0_4_ = iVar7.position_;
        local_1d8 = (undefined1  [8])__end4._8_8_;
        iVar7 = absl::lts_20250127::container_internal::
                btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                ::end((btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>_>
                       *)__begin4._8_8_);
        kv = (pair<const_int,_const_google::protobuf::OneofDescriptor_*> *)iVar7.node_;
        local_200 = iVar7.position_;
        local_1f8 = (undefined1  [8])kv;
        __end4.node_._0_4_ = local_200;
        while (bVar2 = absl::lts_20250127::container_internal::
                       btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                       ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                                     *)local_1d8,(iterator *)local_1f8), bVar2) {
          oneof = (OneofDescriptor *)
                  absl::lts_20250127::container_internal::
                  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                  ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                               *)local_1d8);
          pPVar1 = local_18;
          local_218 = (OneofDescriptor *)(oneof->all_names_).payload_;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)auStack_228,
                     "result.$oneof_name$Case_ = $oneof_name$Case_;\nresult.$oneof_name$_ = this.$oneof_name$_;\n"
                    );
          args_1 = Context::GetOneofGeneratorInfo(this->context_,local_218);
          io::Printer::Print<char[11],std::__cxx11::string>
                    (pPVar1,_auStack_228,(char (*) [11])0xa82482,&args_1->name);
          for (field_1._4_4_ = 0; iVar4 = field_1._4_4_,
              iVar3 = OneofDescriptor::field_count(local_218), iVar4 < iVar3;
              field_1._4_4_ = field_1._4_4_ + 1) {
            pFVar5 = OneofDescriptor::field(local_218,field_1._4_4_);
            pDVar6 = FieldDescriptor::message_type(pFVar5);
            if (pDVar6 != (Descriptor *)0x0) {
              pFVar5 = OneofDescriptor::field(local_218,field_1._4_4_);
              local_238 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>
                          ::get(&this->field_generators_,pFVar5);
              (*(local_238->super_FieldGenerator)._vptr_FieldGenerator[0xd])(local_238,local_18);
            }
          }
          absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
          ::operator++((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                        *)local_1d8);
        }
        io::Printer::Outdent(local_18);
        pPVar1 = local_18;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,"}\n\n")
        ;
        io::Printer::Print<>(pPVar1,local_248);
      }
      return;
    }
    pFVar5 = Descriptor::field(this->descriptor_,local_5c);
    bVar2 = anon_unknown_10::BitfieldTracksMutability(pFVar5);
    pPVar1 = local_18;
    if (bVar2) {
      local_55 = 1;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&i_1,
                 "buildPartialRepeatedFields(result);\n");
      io::Printer::Print<>(pPVar1,_i_1);
      goto LAB_003fffb2;
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

void MessageBuilderGenerator::GenerateBuildPartial(io::Printer* printer) {
  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ buildPartial() {\n"
      "  $classname$ result = new $classname$(this);\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Indent();

  // Handle the repeated fields first so that the "mutable bits" are cleared.
  bool has_repeated_fields = false;
  for (int i = 0; i < descriptor_->field_count(); ++i) {
    if (BitfieldTracksMutability(descriptor_->field(i))) {
      has_repeated_fields = true;
      printer->Print("buildPartialRepeatedFields(result);\n");
      break;
    }
  }

  // One buildPartial#() per from_bit_field
  int totalBuilderInts = (descriptor_->field_count() + 31) / 32;
  if (totalBuilderInts > 0) {
    for (int i = 0; i < totalBuilderInts; ++i) {
      printer->Print(
          "if ($bit_field_name$ != 0) { buildPartial$piece$(result); }\n",
          "bit_field_name", GetBitFieldName(i), "piece", absl::StrCat(i));
    }
  }

  if (!oneofs_.empty()) {
    printer->Print("buildPartialOneofs(result);\n");
  }

  printer->Outdent();
  printer->Print(
      "  onBuilt();\n"
      "  return result;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  // Build Repeated Fields
  if (has_repeated_fields) {
    printer->Print(
        "private void buildPartialRepeatedFields($classname$ result) {\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_));
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); ++i) {
      if (BitfieldTracksMutability(descriptor_->field(i))) {
        const ImmutableFieldGenerator& field =
            field_generators_.get(descriptor_->field(i));
        field.GenerateBuildingCode(printer);
      }
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }

  // Build non-oneof fields
  int start_field = 0;
  for (int i = 0; i < totalBuilderInts; i++) {
    start_field = GenerateBuildPartialPiece(printer, i, start_field);
  }

  // Build Oneofs
  if (!oneofs_.empty()) {
    printer->Print("private void buildPartialOneofs($classname$ result) {\n",
                   "classname",
                   name_resolver_->GetImmutableClassName(descriptor_));
    printer->Indent();
    for (auto& kv : oneofs_) {
      const OneofDescriptor* oneof = kv.second;
      printer->Print(
          "result.$oneof_name$Case_ = $oneof_name$Case_;\n"
          "result.$oneof_name$_ = this.$oneof_name$_;\n",
          "oneof_name", context_->GetOneofGeneratorInfo(oneof)->name);
      for (int i = 0; i < oneof->field_count(); ++i) {
        if (oneof->field(i)->message_type() != nullptr) {
          const ImmutableFieldGenerator& field =
              field_generators_.get(oneof->field(i));
          field.GenerateBuildingCode(printer);
        }
      }
    }
    printer->Outdent();
    printer->Print("}\n\n");
  }
}